

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O3

bool __thiscall cinatra::uri_t::parse_from(uri_t *this,char *encoded)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  byte bVar4;
  int iVar5;
  char *pcVar6;
  byte *pbVar7;
  char *uinfo_begin;
  long lVar8;
  long lVar9;
  char *path_begin;
  byte *pbVar10;
  byte *pbVar11;
  long lVar12;
  byte *pbVar13;
  size_type __rlen;
  size_t sVar14;
  byte *pbVar15;
  bool bVar16;
  
  pcVar6 = encoded;
LAB_001cfb9a:
  cVar1 = *pcVar6;
  if ((cVar1 == '\0') || (cVar1 == '/')) {
    sVar14 = (this->schema)._M_len;
  }
  else {
    if (cVar1 != ':') goto code_r0x001cfbab;
    iVar5 = isalpha((int)*encoded);
    if (iVar5 == 0) {
      return false;
    }
    bVar4 = encoded[1];
    pcVar3 = encoded + 1;
    pcVar6 = encoded;
    while (pcVar2 = pcVar3, bVar4 != 0x3a) {
      iVar5 = isalnum((int)(char)bVar4);
      if (iVar5 == 0) {
        if (0x2e < bVar4) {
          return false;
        }
        if ((0x680000000000U >> ((ulong)bVar4 & 0x3f) & 1) == 0) {
          return false;
        }
      }
      pcVar3 = pcVar2 + 1;
      pcVar6 = pcVar2;
      bVar4 = pcVar2[1];
    }
    sVar14 = (long)pcVar2 - (long)encoded;
    (this->schema)._M_len = sVar14;
    (this->schema)._M_str = encoded;
    if (sVar14 == 3) {
      bVar16 = encoded[2] == 's' && *(short *)encoded == 0x7377;
    }
    else if (sVar14 == 5) {
      bVar16 = encoded[4] == 's' && *(int *)encoded == 0x70747468;
    }
    else {
      bVar16 = false;
    }
    this->is_ssl = bVar16;
    encoded = pcVar6 + 2;
  }
  if (sVar14 == 0) {
    return false;
  }
  bVar4 = *encoded;
  if (bVar4 == 0x2f) {
    if (((byte *)encoded)[1] == 0x2f) {
      pbVar11 = (byte *)encoded + 2;
      lVar12 = 0;
      lVar8 = 0;
      while( true ) {
        bVar4 = pbVar11[lVar12];
        if (((ulong)bVar4 < 0x40) && ((0x8000800800000001U >> ((ulong)bVar4 & 0x3f) & 1) != 0))
        break;
        bVar16 = is_authority_character(this,(int)(char)bVar4);
        if (!bVar16) {
          return false;
        }
        lVar8 = lVar8 + -1;
        lVar12 = lVar12 + 1;
      }
      pbVar10 = pbVar11 + -lVar8;
      if (lVar8 != 0) {
        pbVar13 = (byte *)encoded + (3 - lVar8);
        sVar14 = 0xffffffffffffffff;
        do {
          pbVar7 = pbVar13 + -2;
          sVar14 = sVar14 + 1;
          pbVar13 = pbVar13 + -1;
          lVar9 = lVar8 + 1;
          if (lVar8 == -1) break;
          lVar8 = lVar9;
        } while ((int)(char)*pbVar7 - 0x30U < 10);
        pbVar15 = pbVar10;
        if (*pbVar7 == 0x3a) {
          pbVar15 = pbVar11 + -lVar9;
          (this->port)._M_len = sVar14;
          (this->port)._M_str = (char *)pbVar13;
        }
        lVar8 = 1;
        pbVar13 = pbVar11;
        do {
          pbVar7 = pbVar13;
          bVar16 = is_user_info_character(this,(int)(char)*pbVar7);
          lVar8 = lVar8 + -1;
          if (pbVar7 == pbVar15) break;
          pbVar13 = pbVar7 + 1;
        } while (bVar16);
        pbVar13 = pbVar11;
        if (*pbVar7 == 0x40) {
          (this->uinfo)._M_len = -lVar8;
          (this->uinfo)._M_str = (char *)pbVar11;
          pbVar13 = pbVar7 + 1;
        }
        (this->host)._M_len = (long)pbVar15 - (long)pbVar13;
        (this->host)._M_str = (char *)pbVar13;
        bVar4 = pbVar11[lVar12];
      }
      encoded = (char *)pbVar10;
      if (bVar4 != 0x2f) goto LAB_001cfcc9;
    }
  }
  else {
LAB_001cfcc9:
    bVar16 = is_path_character(this,(int)(char)bVar4);
    if (!bVar16) goto LAB_001cfdd4;
  }
  sVar14 = 0;
  while( true ) {
    bVar4 = ((byte *)encoded)[sVar14];
    if (((ulong)bVar4 < 0x40) && ((0x8000000800000001U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) break;
    bVar16 = is_path_character(this,(int)(char)bVar4);
    if (!bVar16) {
      return false;
    }
    sVar14 = sVar14 + 1;
  }
  (this->path)._M_len = sVar14;
  (this->path)._M_str = encoded;
  encoded = (char *)((byte *)encoded + sVar14);
LAB_001cfdd4:
  bVar4 = *encoded;
  if (bVar4 == 0x3f) {
    pbVar11 = (byte *)encoded + 1;
    for (sVar14 = 0; (bVar4 = pbVar11[sVar14], bVar4 != 0 && (bVar4 != 0x23)); sVar14 = sVar14 + 1)
    {
      bVar16 = is_path_character(this,(int)(char)bVar4);
      if ((bVar4 != 0x3f) && (!bVar16)) {
        return false;
      }
    }
    (this->query)._M_len = sVar14;
    (this->query)._M_str = (char *)pbVar11;
    bVar4 = pbVar11[sVar14];
    encoded = (char *)(pbVar11 + sVar14);
  }
  if (bVar4 != 0x23) {
    return true;
  }
  bVar4 = ((byte *)encoded)[1];
  pbVar10 = (byte *)encoded + 1;
  pbVar11 = pbVar10;
  while( true ) {
    if (bVar4 == 0) {
      (this->fragment)._M_len = (long)pbVar11 - (long)pbVar10;
      (this->fragment)._M_str = (char *)pbVar10;
      return true;
    }
    bVar16 = is_path_character(this,(int)(char)bVar4);
    if ((bVar4 != 0x3f) && (!bVar16)) break;
    bVar4 = pbVar11[1];
    pbVar11 = pbVar11 + 1;
  }
  return false;
code_r0x001cfbab:
  pcVar6 = pcVar6 + 1;
  goto LAB_001cfb9a;
}

Assistant:

bool parse_from(const char *encoded) {
    const char *p = encoded;

    // IMPORTANT -- A uri may either be an absolute uri, or an
    // relative-reference Absolute: 'http://host.com' Relative-Reference:
    // '//:host.com', '/path1/path2?query', './path1:path2' A Relative-Reference
    // can be disambiguated by parsing for a ':' before the first slash

    bool is_relative_reference = true;
    const char *p2 = p;
    for (; *p2 != ('/') && *p2 != ('\0'); p2++) {
      if (*p2 == (':')) {
        // found a colon, the first portion is a scheme
        is_relative_reference = false;
        break;
      }
    }

    if (!is_relative_reference) {
      // the first character of a scheme must be a letter
      if (!isalpha(*p)) {
        return false;
      }

      // start parsing the scheme, it's always delimited by a colon (must be
      // present)
      auto scheme_begin = p++;
      for (; *p != ':'; p++) {
        if (!is_scheme_character(*p)) {
          return false;
        }
      }
      auto scheme_end = p;
      schema = std::string_view(scheme_begin, scheme_end - scheme_begin);
      is_ssl = (schema == "https" || schema == "wss");

      // skip over the colon
      p++;
    }

    // the uri must have http or https
    if (schema.empty()) {
      return false;
    }

    // if we see two slashes next, then we're going to parse the authority
    // portion later on we'll break up the authority into the port and host
    const char *authority_begin = nullptr;
    const char *authority_end = nullptr;
    if (*p == ('/') && p[1] == ('/')) {
      // skip over the slashes
      p += 2;
      authority_begin = p;

      // the authority is delimited by a slash (resource), question-mark (query)
      // or octothorpe (fragment) or by EOS. The authority could be empty
      // ('file:///C:\file_name.txt')
      for (; *p != ('/') && *p != ('?') && *p != ('#') && *p != ('\0'); p++) {
        // We're NOT currently supporting IPvFuture or username/password in
        // authority IPv6 as the host (i.e. http://[:::::::]) is allowed as
        // valid URI and passed to subsystem for support.
        if (!is_authority_character(*p)) {
          return false;
        }
      }
      authority_end = p;

      // now lets see if we have a port specified -- by working back from the
      // end
      if (authority_begin != authority_end) {
        // the port is made up of all digits
        const char *port_begin = authority_end - 1;
        for (; isdigit(*port_begin) && port_begin != authority_begin;
             port_begin--) {
        }

        const char *host_begin = nullptr;
        const char *host_end = nullptr;
        if (*port_begin == (':')) {
          // has a port
          host_begin = authority_begin;
          host_end = port_begin;

          // skip the colon
          port_begin++;

          port = std::string_view(port_begin, authority_end - port_begin);
        }
        else {
          // no port
          host_begin = authority_begin;
          host_end = authority_end;
        }

        // look for a user_info component
        const char *u_end = host_begin;
        for (; is_user_info_character(*u_end) && u_end != host_end; u_end++) {
        }

        if (*u_end == ('@')) {
          host_begin = u_end + 1;
          auto uinfo_begin = authority_begin;
          auto uinfo_end = u_end;
          uinfo = std::string_view(uinfo_begin, uinfo_end - uinfo_begin);
        }
        host = std::string_view(host_begin, host_end - host_begin);
      }
    }

    // if we see a path character or a slash, then the
    // if we see a slash, or any other legal path character, parse the path next
    if (*p == ('/') || is_path_character(*p)) {
      auto path_begin = p;

      // the path is delimited by a question-mark (query) or octothorpe
      // (fragment) or by EOS
      for (; *p != ('?') && *p != ('#') && *p != ('\0'); p++) {
        if (!is_path_character(*p)) {
          return false;
        }
      }
      auto path_end = p;
      path = std::string_view(path_begin, path_end - path_begin);
    }

    // if we see a ?, then the query is next
    if (*p == ('?')) {
      // skip over the question mark
      p++;
      auto query_begin = p;

      // the query is delimited by a '#' (fragment) or EOS
      for (; *p != ('#') && *p != ('\0'); p++) {
        if (!is_query_character(*p)) {
          return false;
        }
      }
      auto query_end = p;
      query = std::string_view(query_begin, query_end - query_begin);
    }

    // if we see a #, then the fragment is next
    if (*p == ('#')) {
      // skip over the hash mark
      p++;
      auto fragment_begin = p;

      // the fragment is delimited by EOS
      for (; *p != ('\0'); p++) {
        if (!is_fragment_character(*p)) {
          return false;
        }
      }
      auto fragment_end = p;
      fragment =
          std::string_view(fragment_begin, fragment_end - fragment_begin);
    }

    return true;
  }